

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void mbedtls_des_setkey(uint32_t *SK,uchar *key)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar7 = (uint)key[3] | (uint)key[1] << 0x10 | (uint)*key << 0x18 | (uint)key[2] << 8;
  uVar1 = *(uint *)(key + 4);
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uVar3 >> 4 ^ uVar7) & 0xf0f0f0f;
  uVar6 = uVar1 ^ uVar7;
  uVar1 = (uVar1 << 4 ^ uVar3) & 0xefefefef | uVar7 & 0x10101010;
  uVar3 = (LHs[*key >> 5] << 4 |
           *(int *)((long)LHs + (ulong)(uVar6 >> 0x13 & 0x3c)) << 5 |
           *(int *)((long)LHs + (ulong)(uVar6 >> 0xb & 0x3c)) << 6 |
           *(int *)((long)LHs + (ulong)(uVar6 >> 3 & 0x3c)) << 7 |
          *(int *)((long)LHs + (ulong)(uVar6 >> 0xe & 0x3c)) * 2 |
          *(int *)((long)LHs + (ulong)(uVar6 >> 6 & 0x3c)) << 2 | LHs[uVar6 & 0xf] << 3 |
          *(uint *)((long)LHs + (ulong)(uVar6 >> 0x16 & 0x3c))) & 0xfffffff;
  uVar1 = (RHs[uVar1 >> 0x1c] << 4 |
           *(int *)((long)RHs + (ulong)(uVar1 >> 0x12 & 0x3c)) << 5 |
           *(int *)((long)RHs + (ulong)(uVar1 >> 10 & 0x3c)) << 6 |
           *(int *)((long)RHs + (ulong)(uVar1 >> 2 & 0x3c)) << 7 |
          *(int *)((long)RHs + (ulong)(uVar1 >> 0xf & 0x3c)) * 2 |
          *(int *)((long)RHs + (ulong)(uVar1 >> 7 & 0x3c)) << 2 |
          *(int *)((long)RHs + (ulong)(uVar1 & 0x1e) * 2) << 3 |
          *(uint *)((long)RHs + (ulong)(uVar1 >> 0x17 & 0x3c))) & 0xfffffff;
  lVar8 = 0;
  do {
    if (((uint)lVar8 < 0x10) && ((0x8103U >> ((uint)lVar8 & 0x1f) & 1) != 0)) {
      uVar6 = 0xffffffe;
      sVar5 = 0x1b;
      sVar2 = 1;
    }
    else {
      uVar6 = 0xffffffc;
      sVar5 = 0x1a;
      sVar2 = 2;
    }
    uVar9 = uVar3 << sVar2;
    uVar10 = uVar3 >> sVar5;
    uVar4 = uVar9 & uVar6;
    uVar3 = uVar4 | uVar10;
    uVar7 = uVar1 << sVar2;
    uVar11 = uVar1 >> sVar5;
    uVar1 = uVar6 & uVar7 | uVar11;
    uVar6 = (uVar6 & uVar7) >> 0xe;
    SK[lVar8 * 2] =
         uVar7 >> 0x18 & 1 | uVar7 >> 0x1a & 2 |
         uVar7 >> 0x12 & 4 |
         uVar1 >> 3 & 8 |
         uVar7 >> 10 & 0x10 |
         uVar7 >> 5 & 0x20 | uVar6 & 0x200 | uVar7 >> 1 & 0x400 | (uVar1 & 0x20) << 6 |
         uVar7 & 0x100 | uVar9 >> 10 & 0x10000 | uVar4 * 4 & 0x20000 | uVar3 << 10 & 0x40000 |
         uVar7 >> 0xd & 0x2000 | uVar7 >> 4 & 0x1000 |
         uVar9 >> 1 & 0x100000 |
         (uVar9 & 0x1000) << 9 |
         (uVar9 & 0x40000) << 6 |
         (uVar3 & 0x82) << 0x12 |
         (uVar9 & 0x2000) << 0xe | (uVar10 & 1) << 0x1c | (uVar4 & 0x2400000) << 4;
    SK[lVar8 * 2 + 1] =
         uVar7 >> 0x15 & 2 |
         (uVar11 & 1) << 2 |
         uVar1 >> 3 & 0x11 |
         uVar7 >> 7 & 0x20 | (uVar1 & 2) << 7 | uVar7 >> 9 & 0x400 | uVar6 & 0x808 |
         uVar7 & 0x200 |
         uVar9 >> 4 & 0x10000 |
         uVar3 << 0xf & 0x20000 |
         uVar9 >> 6 & 0x40000 | (uVar4 & 0x10000) << 3 | (uVar9 & 0x200) << 0xb |
         uVar7 >> 2 & 0x2000 | (uVar1 & 0x10) << 8 |
         (uVar3 & 0x20) << 0x10 |
         (uVar9 >> 2 & 0x2000000 |
         (uVar3 & 0x10) << 0x16 |
         uVar3 << 10 & 0x8000000 | (uVar9 & 0x800) << 0x11 | uVar3 << 0xf & 0x20000000) +
         (uVar4 & 0x800000) * 2;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 0x10);
  return;
}

Assistant:

void mbedtls_des_setkey( uint32_t SK[32], const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;
    uint32_t X, Y, T;

    GET_UINT32_BE( X, key, 0 );
    GET_UINT32_BE( Y, key, 4 );

    /*
     * Permuted Choice 1
     */
    T =  ((Y >>  4) ^ X) & 0x0F0F0F0F;  X ^= T; Y ^= (T <<  4);
    T =  ((Y      ) ^ X) & 0x10101010;  X ^= T; Y ^= (T      );

    X =   (LHs[ (X      ) & 0xF] << 3) | (LHs[ (X >>  8) & 0xF ] << 2)
        | (LHs[ (X >> 16) & 0xF] << 1) | (LHs[ (X >> 24) & 0xF ]     )
        | (LHs[ (X >>  5) & 0xF] << 7) | (LHs[ (X >> 13) & 0xF ] << 6)
        | (LHs[ (X >> 21) & 0xF] << 5) | (LHs[ (X >> 29) & 0xF ] << 4);

    Y =   (RHs[ (Y >>  1) & 0xF] << 3) | (RHs[ (Y >>  9) & 0xF ] << 2)
        | (RHs[ (Y >> 17) & 0xF] << 1) | (RHs[ (Y >> 25) & 0xF ]     )
        | (RHs[ (Y >>  4) & 0xF] << 7) | (RHs[ (Y >> 12) & 0xF ] << 6)
        | (RHs[ (Y >> 20) & 0xF] << 5) | (RHs[ (Y >> 28) & 0xF ] << 4);

    X &= 0x0FFFFFFF;
    Y &= 0x0FFFFFFF;

    /*
     * calculate subkeys
     */
    for( i = 0; i < 16; i++ )
    {
        if( i < 2 || i == 8 || i == 15 )
        {
            X = ((X <<  1) | (X >> 27)) & 0x0FFFFFFF;
            Y = ((Y <<  1) | (Y >> 27)) & 0x0FFFFFFF;
        }
        else
        {
            X = ((X <<  2) | (X >> 26)) & 0x0FFFFFFF;
            Y = ((Y <<  2) | (Y >> 26)) & 0x0FFFFFFF;
        }

        *SK++ =   ((X <<  4) & 0x24000000) | ((X << 28) & 0x10000000)
                | ((X << 14) & 0x08000000) | ((X << 18) & 0x02080000)
                | ((X <<  6) & 0x01000000) | ((X <<  9) & 0x00200000)
                | ((X >>  1) & 0x00100000) | ((X << 10) & 0x00040000)
                | ((X <<  2) & 0x00020000) | ((X >> 10) & 0x00010000)
                | ((Y >> 13) & 0x00002000) | ((Y >>  4) & 0x00001000)
                | ((Y <<  6) & 0x00000800) | ((Y >>  1) & 0x00000400)
                | ((Y >> 14) & 0x00000200) | ((Y      ) & 0x00000100)
                | ((Y >>  5) & 0x00000020) | ((Y >> 10) & 0x00000010)
                | ((Y >>  3) & 0x00000008) | ((Y >> 18) & 0x00000004)
                | ((Y >> 26) & 0x00000002) | ((Y >> 24) & 0x00000001);

        *SK++ =   ((X << 15) & 0x20000000) | ((X << 17) & 0x10000000)
                | ((X << 10) & 0x08000000) | ((X << 22) & 0x04000000)
                | ((X >>  2) & 0x02000000) | ((X <<  1) & 0x01000000)
                | ((X << 16) & 0x00200000) | ((X << 11) & 0x00100000)
                | ((X <<  3) & 0x00080000) | ((X >>  6) & 0x00040000)
                | ((X << 15) & 0x00020000) | ((X >>  4) & 0x00010000)
                | ((Y >>  2) & 0x00002000) | ((Y <<  8) & 0x00001000)
                | ((Y >> 14) & 0x00000808) | ((Y >>  9) & 0x00000400)
                | ((Y      ) & 0x00000200) | ((Y <<  7) & 0x00000100)
                | ((Y >>  7) & 0x00000020) | ((Y >>  3) & 0x00000011)
                | ((Y <<  2) & 0x00000004) | ((Y >> 21) & 0x00000002);
    }
}